

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplex.cpp
# Opt level: O1

void appendBasicRowsToBasis(HighsLp *lp,HighsBasis *highs_basis,HighsInt XnumNewRow)

{
  uint uVar1;
  int iVar2;
  
  if (highs_basis->valid == false) {
    puts("\n!!Appending columns to invalid basis!!\n");
  }
  if (XnumNewRow != 0) {
    iVar2 = XnumNewRow + lp->num_row_;
    std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::resize
              (&highs_basis->row_status,(long)iVar2);
    uVar1 = lp->num_row_;
    if ((int)uVar1 < iVar2) {
      memset((highs_basis->row_status).
             super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
             super__Vector_impl_data._M_start + (int)uVar1,1,(ulong)(iVar2 + ~uVar1) + 1);
      return;
    }
  }
  return;
}

Assistant:

void appendBasicRowsToBasis(HighsLp& lp, HighsBasis& highs_basis,
                            HighsInt XnumNewRow) {
  assert(highs_basis.valid);
  if (!highs_basis.valid) {
    printf("\n!!Appending columns to invalid basis!!\n\n");
  }
  // Add basic logicals
  if (XnumNewRow == 0) return;
  HighsInt newNumRow = lp.num_row_ + XnumNewRow;
  highs_basis.row_status.resize(newNumRow);
  // Make the new rows basic
  for (HighsInt iRow = lp.num_row_; iRow < newNumRow; iRow++) {
    highs_basis.row_status[iRow] = HighsBasisStatus::kBasic;
  }
}